

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::ByteStreamSplitDecoder::Skip(ByteStreamSplitDecoder *this,uint8_t *defines,idx_t skip_count)

{
  type tVar1;
  idx_t iVar2;
  pointer pBVar3;
  runtime_error *this_00;
  
  iVar2 = ColumnReader::GetValidCount(this->reader,defines,skip_count,0);
  tVar1 = this->reader->column_schema->parquet_type;
  if (tVar1 == DOUBLE) {
    pBVar3 = unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::
             operator->(&this->bss_decoder);
    BssDecoder::Skip<double>(pBVar3,(uint32_t)iVar2);
    return;
  }
  if (tVar1 == FLOAT) {
    pBVar3 = unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::
             operator->(&this->bss_decoder);
    BssDecoder::Skip<float>(pBVar3,(uint32_t)iVar2);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error
            (this_00,"BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ByteStreamSplitDecoder::Skip(uint8_t *defines, idx_t skip_count) {
	idx_t valid_count = reader.GetValidCount(defines, skip_count);
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::FLOAT:
		bss_decoder->Skip<float>(valid_count);
		break;
	case duckdb_parquet::Type::DOUBLE:
		bss_decoder->Skip<double>(valid_count);
		break;
	default:
		throw std::runtime_error("BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
	}
}